

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O3

Error asmjit::x86::FuncInternal::initCallConv(CallConv *cc,uint32_t ccId,Environment *environment)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  Error EVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  
  bVar6 = environment->_platform == '\x01';
  bVar7 = environment->_abi == '\x01';
  cc->_arch = environment->_arch;
  cc->_saveRestoreRegSize[1] = '\x10';
  cc->_saveRestoreRegSize[2] = '\b';
  cc->_saveRestoreRegSize[3] = '\b';
  cc->_saveRestoreAlignment[1] = '\x10';
  cc->_saveRestoreAlignment[2] = '\b';
  cc->_saveRestoreAlignment[3] = '\b';
  if ((environment->_arch & 1) == 0) {
    cc->_saveRestoreRegSize[0] = '\b';
    cc->_saveRestoreAlignment[0] = '\b';
    uVar5 = (bVar7 || bVar6) | 0x20;
    uVar2 = ccId;
    if ((ccId & 0xfffffffb) - 1 < 3) {
      uVar2 = uVar5;
    }
    bVar6 = ccId == 8;
    ccId = uVar2;
    if (bVar6) {
      ccId = uVar5;
    }
    if (ccId - 0x10 < 3) {
      cc->_flags = 4;
      cc->_naturalStackAlignment = '\x10';
      *(undefined8 *)cc->_passedOrder = 0xffffff0706010200;
      *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
      *(undefined8 *)(cc->_passedOrder + 2) = 0x706050403020100;
      *(undefined8 *)((long)cc->_passedOrder + 0x28) = 0xffffffffffffffff;
      *(undefined8 *)(cc->_passedOrder + 1) = 0x706050403020100;
      *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
      *(undefined8 *)(cc->_passedOrder + 3) = 0x706050403020100;
      *(undefined8 *)((long)cc->_passedOrder + 0x38) = 0xffffffffffffffff;
      cc->_passedRegs[0] = 199;
      cc->_passedRegs[1] = 0xff;
      cc->_passedRegs[2] = 0xff;
      cc->_passedRegs[3] = 0xff;
      cc->_preservedRegs[0] = 0xffff;
      cc->_preservedRegs[1] = (uint32_t)(-1L << ((char)ccId - 0xeU & 0x3f));
    }
    else if (ccId == 4) {
      cc->_strategy = '\x02';
      cc->_spillZoneSize = '0';
      cc->_naturalStackAlignment = '\x10';
      cc->_flags = 0x14;
      *(undefined8 *)cc->_passedOrder = 0xffffffff09080201;
      *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
      cc->_passedRegs[0] = 0x306;
      cc->_passedRegs[1] = 0x3f;
      *(undefined8 *)(cc->_passedOrder + 1) = 0xffff050403020100;
      *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
      cc->_preservedRegs[0] = 0xf0f8;
      cc->_preservedRegs[1] = 0xffc0;
      ccId = 4;
    }
    else if (ccId == 0x21) {
      cc->_strategy = '\x01';
      cc->_spillZoneSize = ' ';
      cc->_naturalStackAlignment = '\x10';
      cc->_flags = 0x96;
      *(undefined8 *)cc->_passedOrder = 0xffffffff09080201;
      *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
      cc->_passedRegs[0] = 0x306;
      cc->_passedRegs[1] = 0xf;
      *(undefined8 *)(cc->_passedOrder + 1) = 0xffffffff03020100;
      *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
      cc->_preservedRegs[0] = 0xf0f8;
      cc->_preservedRegs[1] = 0xffc0;
      ccId = 0x21;
    }
    else {
      if (ccId != 0x20) {
        return 2;
      }
      cc->_flags = 0xa4;
      cc->_naturalStackAlignment = '\x10';
      cc->_redZoneSize = 0x80;
      *(undefined8 *)cc->_passedOrder = 0xffff090801020607;
      *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
      cc->_passedRegs[0] = 0x3c6;
      cc->_passedRegs[1] = 0xff;
      *(undefined8 *)(cc->_passedOrder + 1) = 0x706050403020100;
      *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
      cc->_preservedRegs[0] = 0xf038;
      ccId = 0x20;
    }
    goto LAB_0012d838;
  }
  cc->_saveRestoreRegSize[0] = '\x04';
  cc->_saveRestoreAlignment[0] = '\x04';
  cc->_preservedRegs[0] = 0xf8;
  cc->_naturalStackAlignment = '\x04';
  EVar4 = 2;
  bVar3 = true;
  switch(ccId) {
  case 1:
    goto switchD_0012d618_caseD_1;
  case 2:
    cc->_flags = 1;
    ccId = 2;
    break;
  case 3:
    cc->_flags = 1;
    *(undefined8 *)cc->_passedOrder = 0xffffffffffff0201;
    *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
    cc->_passedRegs[0] = 6;
    ccId = 3;
    break;
  case 4:
    cc->_flags = 1;
    *(undefined8 *)cc->_passedOrder = 0xffffffffffff0201;
    *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
    cc->_passedRegs[0] = 6;
    cc->_passedRegs[1] = 0x3f;
    *(undefined8 *)(cc->_passedOrder + 1) = 0xffff050403020100;
    *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
    ccId = 4;
    break;
  case 5:
    if (bVar7 || bVar6) {
      cc->_flags = 1;
      *(undefined8 *)cc->_passedOrder = 0xffffffffffffff01;
      *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
      cc->_passedRegs[0] = 2;
      ccId = 5;
      break;
    }
    ccId = 1;
    goto switchD_0012d618_caseD_1;
  case 6:
    *(undefined8 *)cc->_passedOrder = 0xffffffffffffff00;
    *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
    cc->_passedRegs[0] = 1;
    ccId = 6;
    break;
  case 7:
    *(undefined8 *)cc->_passedOrder = 0xffffffffffff0200;
    *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
    cc->_passedRegs[0] = 5;
    ccId = 7;
    break;
  case 8:
    *(undefined8 *)cc->_passedOrder = 0xffffffffff010200;
    *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
    cc->_passedRegs[0] = 7;
    ccId = 8;
    break;
  default:
    goto switchD_0012d618_caseD_9;
  case 0x10:
  case 0x11:
  case 0x12:
    cc->_flags = 4;
    *(undefined8 *)cc->_passedOrder = 0xffffff0706010200;
    *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
    *(undefined8 *)(cc->_passedOrder + 2) = 0x706050403020100;
    *(undefined8 *)((long)cc->_passedOrder + 0x28) = 0xffffffffffffffff;
    *(undefined8 *)(cc->_passedOrder + 1) = 0x706050403020100;
    *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
    *(undefined8 *)(cc->_passedOrder + 3) = 0x706050403020100;
    *(undefined8 *)((long)cc->_passedOrder + 0x38) = 0xffffffffffffffff;
    cc->_passedRegs[0] = 199;
    cc->_passedRegs[1] = 0xff;
    cc->_passedRegs[2] = 0xff;
    cc->_passedRegs[3] = 0xff;
    cc->_preservedRegs[0] = 0xff;
    cc->_preservedRegs[1] = (uint)(-1L << ((char)ccId - 0xeU & 0x3f)) & 0xff;
    cc->_naturalStackAlignment = '\x10';
    goto LAB_0012d838;
  }
  bVar3 = false;
switchD_0012d618_caseD_1:
  *(undefined8 *)(cc->_passedOrder + 2) = 0xffffffffff020100;
  *(undefined8 *)((long)cc->_passedOrder + 0x28) = 0xffffffffffffffff;
  *(undefined8 *)(cc->_passedOrder + 1) = 0xffffffffff020100;
  *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
  cc->_passedRegs[1] = 7;
  cc->_passedRegs[2] = 7;
  uVar1 = cc->_flags;
  cc->_flags = uVar1 | 8;
  if (bVar3) {
    cc->_flags = uVar1 | 0x88;
    ccId = 1;
  }
LAB_0012d838:
  cc->_id = (uint8_t)ccId;
  EVar4 = 0;
switchD_0012d618_caseD_9:
  return EVar4;
}

Assistant:

inline bool isPlatformWindows() const noexcept { return _platform == kPlatformWindows; }